

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IBMPC.cpp
# Opt level: O0

int GetFormatGap(int drive_speed,DataRate datarate,Encoding encoding,int sectors,int size_)

{
  int iVar1;
  int iVar2;
  int iVar3;
  DataRate local_60;
  DataRate local_5c;
  int gap3;
  int overhead;
  int chunk;
  int track_len;
  FORMATGAP *fg;
  FORMATGAP *__end1;
  FORMATGAP *__begin1;
  FORMATGAP (*__range1) [3];
  int size__local;
  int sectors_local;
  Encoding encoding_local;
  DataRate datarate_local;
  int drive_speed_local;
  
  if (sectors == 0) {
    datarate_local = Unknown;
  }
  else {
    for (__end1 = standard_gaps; __end1 != (FORMATGAP *)"invalid empty path"; __end1 = __end1 + 1) {
      if ((((__end1->drivespeed == drive_speed) && (__end1->datarate == datarate)) &&
          (__end1->encoding == encoding)) &&
         ((__end1->sectors == sectors && (__end1->size == size_)))) {
        return __end1->gap3;
      }
    }
    iVar1 = GetTrackCapacity(drive_speed,datarate,encoding);
    iVar2 = GetTrackOverhead(encoding);
    iVar1 = (iVar1 - iVar2) / sectors;
    iVar2 = Sector::SizeCodeToLength(size_);
    iVar3 = GetSectorOverhead(encoding);
    if (iVar2 + iVar3 < iVar1) {
      local_5c = iVar1 - (iVar2 + iVar3);
    }
    else {
      local_5c = Unknown;
    }
    if ((int)local_5c < 0x53) {
      local_60 = local_5c;
    }
    else {
      local_60 = 0x52;
    }
    datarate_local = local_60;
  }
  return datarate_local;
}

Assistant:

int GetFormatGap(int drive_speed, DataRate datarate, Encoding encoding, int sectors, int size_)
{
    if (!sectors) return 0;

    // Check for common formats that use specific gap sizes
    for (auto& fg : standard_gaps)
    {
        // If the format matches exactly, return the known gap
        if (fg.drivespeed == drive_speed && fg.datarate == datarate && fg.encoding == encoding &&
            fg.sectors == sectors && fg.size == size_)
            return fg.gap3;
    }

    auto track_len = GetTrackCapacity(drive_speed, datarate, encoding) - GetTrackOverhead(encoding);
    auto chunk = track_len / sectors;
    auto overhead = Sector::SizeCodeToLength(size_) + GetSectorOverhead(encoding);
    auto gap3 = (chunk > overhead) ? chunk - overhead : 0;
    return (gap3 > MAX_GAP3) ? MAX_GAP3 : gap3;
}